

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O2

int __thiscall zmq::ctx_t::shutdown(ctx_t *this,int __fd,int __how)

{
  pointer ppsVar1;
  pointer ppsVar2;
  pointer ppsVar3;
  long lVar4;
  scoped_lock_t locker;
  scoped_lock_t local_20;
  
  local_20._mutex = &this->_slot_sync;
  mutex_t::lock(local_20._mutex);
  if ((this->_terminating == false) && (this->_terminating = true, this->_starting == false)) {
    ppsVar1 = (this->_sockets)._items.
              super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppsVar2 = (this->_sockets)._items.
              super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (lVar4 = 0;
        ppsVar3 = (this->_sockets)._items.
                  super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (long)ppsVar1 - (long)ppsVar2 >> 3 != lVar4; lVar4 = lVar4 + 1) {
      socket_base_t::stop(ppsVar3[lVar4]);
    }
    if (ppsVar3 ==
        (this->_sockets)._items.
        super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      reaper_t::stop(this->_reaper);
    }
  }
  scoped_lock_t::~scoped_lock_t(&local_20);
  return 0;
}

Assistant:

int zmq::ctx_t::shutdown ()
{
    scoped_lock_t locker (_slot_sync);

    if (!_terminating) {
        _terminating = true;

        if (!_starting) {
            //  Send stop command to sockets so that any blocking calls
            //  can be interrupted. If there are no sockets we can ask reaper
            //  thread to stop.
            for (sockets_t::size_type i = 0, size = _sockets.size (); i != size;
                 i++) {
                _sockets[i]->stop ();
            }
            if (_sockets.empty ())
                _reaper->stop ();
        }
    }

    return 0;
}